

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bbands.c
# Opt level: O1

ErrorNumber test_func_bbands(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  TA_Test_conflict4 *pTVar4;
  ulong uVar5;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict4 *local_40;
  TA_Real *local_38;
  
  pTVar4 = tableTest;
  uVar3 = 0;
  do {
    if ((int)history->nbBars < pTVar4->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_bbands.c"
             ,uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,0);
    uVar5 = 0x8a;
    if (TVar1 == TA_SUCCESS) {
      clearAllBuffers();
      setInputBuffer(0,history->close,history->nbBars);
      setInputBuffer(1,history->close,history->nbBars);
      setInputBuffer(2,history->close,history->nbBars);
      setInputBuffer(3,history->close,history->nbBars);
      TA_SetCompatibility(pTVar4->compatibility);
      TVar1 = TA_BBANDS(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInTimePeriod,
                        pTVar4->optInNbDevUp,pTVar4->optInNbDevDn,pTVar4->optInMethod_3,&outBegIdx,
                        &outNbElement,gBuffer[0].out0,gBuffer[0].out1,gBuffer[0].out2);
      EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
      if (EVar2 == TA_TEST_PASS) {
        EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                   pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement,
                                   pTVar4->oneOfTheExpectedOutReal0,
                                   pTVar4->oneOfTheExpectedOutRealIndex0);
        if (EVar2 == TA_TEST_PASS) {
          EVar2 = checkExpectedValue(gBuffer[0].out1,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                     pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement,
                                     pTVar4->oneOfTheExpectedOutReal1,
                                     pTVar4->oneOfTheExpectedOutRealIndex1);
          if (EVar2 == TA_TEST_PASS) {
            EVar2 = checkExpectedValue(gBuffer[0].out2,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                       pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement
                                       ,pTVar4->oneOfTheExpectedOutReal2,
                                       pTVar4->oneOfTheExpectedOutRealIndex2);
            if (EVar2 == TA_TEST_PASS) {
              outNbElement = 0;
              outBegIdx = 0;
              TVar1 = TA_BBANDS(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,
                                pTVar4->optInTimePeriod,pTVar4->optInNbDevUp,pTVar4->optInNbDevDn,
                                pTVar4->optInMethod_3,&outBegIdx,&outNbElement,gBuffer[1].in,
                                gBuffer[1].out1,gBuffer[1].out2);
              EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
              if (EVar2 == TA_TEST_PASS) {
                EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                           pTVar4->expectedBegIdx,outNbElement,
                                           pTVar4->expectedNbElement,
                                           pTVar4->oneOfTheExpectedOutReal0,
                                           pTVar4->oneOfTheExpectedOutRealIndex0);
                if (EVar2 != TA_TEST_PASS) goto LAB_00115d30;
                EVar2 = checkExpectedValue(gBuffer[1].out1,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                           pTVar4->expectedBegIdx,outNbElement,
                                           pTVar4->expectedNbElement,
                                           pTVar4->oneOfTheExpectedOutReal1,
                                           pTVar4->oneOfTheExpectedOutRealIndex1);
                if (EVar2 != TA_TEST_PASS) goto LAB_00115d73;
                EVar2 = checkExpectedValue(gBuffer[1].out2,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                           pTVar4->expectedBegIdx,outNbElement,
                                           pTVar4->expectedNbElement,
                                           pTVar4->oneOfTheExpectedOutReal2,
                                           pTVar4->oneOfTheExpectedOutRealIndex2);
                if (EVar2 != TA_TEST_PASS) goto LAB_00115db6;
                outNbElement = 0;
                outBegIdx = 0;
                TVar1 = TA_BBANDS(pTVar4->startIdx,pTVar4->endIdx,gBuffer[2].in,
                                  pTVar4->optInTimePeriod,pTVar4->optInNbDevUp,pTVar4->optInNbDevDn,
                                  pTVar4->optInMethod_3,&outBegIdx,&outNbElement,gBuffer[2].out1,
                                  gBuffer[2].in,gBuffer[2].out2);
                EVar2 = checkSameContent(gBuffer[1].out1,gBuffer[2].in);
                if (EVar2 == TA_TEST_PASS) {
                  EVar2 = checkExpectedValue(gBuffer[2].out1,TVar1,pTVar4->expectedRetCode,outBegIdx
                                             ,pTVar4->expectedBegIdx,outNbElement,
                                             pTVar4->expectedNbElement,
                                             pTVar4->oneOfTheExpectedOutReal0,
                                             pTVar4->oneOfTheExpectedOutRealIndex0);
                  if (EVar2 != TA_TEST_PASS) goto LAB_00115d30;
                  EVar2 = checkExpectedValue(gBuffer[2].in,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                             pTVar4->expectedBegIdx,outNbElement,
                                             pTVar4->expectedNbElement,
                                             pTVar4->oneOfTheExpectedOutReal1,
                                             pTVar4->oneOfTheExpectedOutRealIndex1);
                  if (EVar2 != TA_TEST_PASS) goto LAB_00115d73;
                  EVar2 = checkExpectedValue(gBuffer[2].out2,TVar1,pTVar4->expectedRetCode,outBegIdx
                                             ,pTVar4->expectedBegIdx,outNbElement,
                                             pTVar4->expectedNbElement,
                                             pTVar4->oneOfTheExpectedOutReal2,
                                             pTVar4->oneOfTheExpectedOutRealIndex2);
                  if (EVar2 != TA_TEST_PASS) goto LAB_00115db6;
                  outNbElement = 0;
                  outBegIdx = 0;
                  TVar1 = TA_BBANDS(pTVar4->startIdx,pTVar4->endIdx,gBuffer[3].in,
                                    pTVar4->optInTimePeriod,pTVar4->optInNbDevUp,
                                    pTVar4->optInNbDevDn,pTVar4->optInMethod_3,&outBegIdx,
                                    &outNbElement,gBuffer[3].out0,gBuffer[3].out1,gBuffer[3].in);
                  EVar2 = checkSameContent(gBuffer[2].out2,gBuffer[3].in);
                  if (EVar2 == TA_TEST_PASS) {
                    EVar2 = checkExpectedValue(gBuffer[3].out0,TVar1,pTVar4->expectedRetCode,
                                               outBegIdx,pTVar4->expectedBegIdx,outNbElement,
                                               pTVar4->expectedNbElement,
                                               pTVar4->oneOfTheExpectedOutReal0,
                                               pTVar4->oneOfTheExpectedOutRealIndex0);
                    if (EVar2 != TA_TEST_PASS) goto LAB_00115d30;
                    EVar2 = checkExpectedValue(gBuffer[3].out1,TVar1,pTVar4->expectedRetCode,
                                               outBegIdx,pTVar4->expectedBegIdx,outNbElement,
                                               pTVar4->expectedNbElement,
                                               pTVar4->oneOfTheExpectedOutReal1,
                                               pTVar4->oneOfTheExpectedOutRealIndex1);
                    if (EVar2 != TA_TEST_PASS) goto LAB_00115d73;
                    EVar2 = checkExpectedValue(gBuffer[3].in,TVar1,pTVar4->expectedRetCode,outBegIdx
                                               ,pTVar4->expectedBegIdx,outNbElement,
                                               pTVar4->expectedNbElement,
                                               pTVar4->oneOfTheExpectedOutReal2,
                                               pTVar4->oneOfTheExpectedOutRealIndex2);
                    if (EVar2 != TA_TEST_PASS) goto LAB_00115db6;
                    local_38 = history->close;
                    local_40 = pTVar4;
                    if ((pTVar4->doRangeTestFlag == 0) ||
                       (EVar2 = doRangeTest(rangeTestFunction,
                                            -(uint)(pTVar4->optInMethod_3 != 1) | TA_FUNC_UNST_EMA,
                                            &local_40,3,0), EVar2 == TA_TEST_PASS)) {
                      uVar5 = 0;
                      goto LAB_00115dcc;
                    }
                  }
                }
              }
              goto LAB_00115cf6;
            }
LAB_00115db6:
            uVar5 = (ulong)EVar2;
          }
          else {
LAB_00115d73:
            uVar5 = (ulong)EVar2;
          }
        }
        else {
LAB_00115d30:
          uVar5 = (ulong)EVar2;
        }
        printf("Fail for output id=%d\n");
      }
      else {
LAB_00115cf6:
        uVar5 = (ulong)EVar2;
      }
    }
LAB_00115dcc:
    if ((ErrorNumber)uVar5 != TA_TEST_PASS) {
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_bbands.c"
             ,uVar3 & 0xffffffff,uVar5);
      return (ErrorNumber)uVar5;
    }
    uVar3 = uVar3 + 1;
    pTVar4 = pTVar4 + 1;
    if (uVar3 == 0x13) {
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_bbands( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i,
                 tableTest[i].expectedNbElement,
                 history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__, i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}